

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2point_vector.cc
# Opt level: O2

bool __thiscall s2coding::EncodedS2PointVector::Init(EncodedS2PointVector *this,Decoder *decoder)

{
  Format FVar1;
  Format FVar2;
  bool bVar3;
  size_t sVar4;
  
  sVar4 = Decoder::avail(decoder);
  if (sVar4 != 0) {
    FVar1 = *decoder->buf_;
    FVar2 = FVar1 & 7;
    this->format_ = FVar2;
    if (FVar2 == CELL_IDS) {
      bVar3 = InitCellIdsFormat(this,decoder);
      return bVar3;
    }
    if ((FVar1 & 7) == UNCOMPRESSED) {
      bVar3 = InitUncompressedFormat(this,decoder);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool EncodedS2PointVector::Init(Decoder* decoder) {
  if (decoder->avail() < 1) return false;

  // Peek at the format but don't advance the decoder; the format-specific
  // Init functions will do that.
  format_ = static_cast<Format>(*decoder->ptr() & kEncodingFormatMask);
  switch (format_) {
    case UNCOMPRESSED:
      return InitUncompressedFormat(decoder);

    case CELL_IDS:
      return InitCellIdsFormat(decoder);

    default:
      return false;
  }
}